

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::AssemblyContext::spvNamedIdAssignOrGet(AssemblyContext *this,char *textValue)

{
  _Rb_tree_color _Var1;
  bool bVar2;
  undefined7 extraout_var;
  iterator iVar4;
  uint uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  undefined4 uVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  uint32_t id;
  allocator<char> local_41;
  char *local_40;
  key_type local_38;
  _Rb_tree_header *p_Var3;
  
  local_40 = textValue;
  if ((this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_38._M_dataplus._M_p._0_4_ = _S_red;
    bVar2 = utils::ParseNumber<unsigned_int>(textValue,(uint *)&local_38);
    p_Var3 = (_Rb_tree_header *)CONCAT71(extraout_var,bVar2);
    bVar10 = true;
    if (bVar2) {
      p_Var3 = &(this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var3->_M_header;
      for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[bVar2]) {
        bVar2 = p_Var7[1]._M_color < (_Rb_tree_color)local_38._M_dataplus._M_p;
        if (!bVar2) {
          p_Var6 = p_Var7;
        }
      }
      p_Var7 = &p_Var3->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var3) &&
         (p_Var7 = p_Var6, (_Rb_tree_color)local_38._M_dataplus._M_p < p_Var6[1]._M_color)) {
        p_Var7 = &p_Var3->_M_header;
      }
      if ((_Rb_tree_header *)p_Var7 != p_Var3) {
        p_Var3 = (_Rb_tree_header *)(ulong)(_Rb_tree_color)local_38._M_dataplus._M_p;
        uVar5 = (_Rb_tree_color)local_38._M_dataplus._M_p + _S_black;
        if ((_Rb_tree_color)local_38._M_dataplus._M_p + _S_black < this->bound_) {
          uVar5 = this->bound_;
        }
        this->bound_ = uVar5;
        bVar10 = false;
      }
    }
    if (!bVar10) {
      return (_Rb_tree_color)p_Var3;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,local_40,&local_41);
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_38._M_dataplus._M_p._4_4_,(_Rb_tree_color)local_38._M_dataplus._M_p) !=
      &local_38.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_38._M_dataplus._M_p._4_4_,
                             (_Rb_tree_color)local_38._M_dataplus._M_p),
                    local_38.field_2._M_allocated_capacity + 1);
  }
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_38._M_dataplus._M_p._0_4_ = this->next_id_;
    this->next_id_ = (_Rb_tree_color)local_38._M_dataplus._M_p + _S_black;
    if ((this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var7 = (this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &(this->ids_to_preserve_)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = p_Var7;
      p_Var9 = &p_Var3->_M_header;
      _Var1 = this->next_id_;
      while( true ) {
        for (; uVar8 = _Var1, p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[bVar10]) {
          bVar10 = p_Var6[1]._M_color < (_Rb_tree_color)local_38._M_dataplus._M_p;
          if (!bVar10) {
            p_Var9 = p_Var6;
          }
          _Var1 = uVar8;
        }
        p_Var6 = &p_Var3->_M_header;
        if (((_Rb_tree_header *)p_Var9 != p_Var3) &&
           (p_Var6 = p_Var9, (_Rb_tree_color)local_38._M_dataplus._M_p < p_Var9[1]._M_color)) {
          p_Var6 = &p_Var3->_M_header;
        }
        if ((_Rb_tree_header *)p_Var6 == p_Var3) break;
        this->next_id_ = uVar8 + _S_black;
        p_Var6 = p_Var7;
        p_Var9 = &p_Var3->_M_header;
        _Var1 = uVar8 + _S_black;
        local_38._M_dataplus._M_p._0_4_ = uVar8;
      }
    }
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const*&,unsigned_int&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this,&local_40,&local_38);
    uVar5 = (_Rb_tree_color)local_38._M_dataplus._M_p + _S_black;
    if ((_Rb_tree_color)local_38._M_dataplus._M_p + _S_black < this->bound_) {
      uVar5 = this->bound_;
    }
    this->bound_ = uVar5;
  }
  else {
    local_38._M_dataplus._M_p._0_4_ =
         *(_Rb_tree_color *)
          ((long)iVar4.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                 ._M_cur + 0x28);
  }
  return (_Rb_tree_color)local_38._M_dataplus._M_p;
}

Assistant:

uint32_t AssemblyContext::spvNamedIdAssignOrGet(const char* textValue) {
  if (!ids_to_preserve_.empty()) {
    uint32_t id = 0;
    if (spvtools::utils::ParseNumber(textValue, &id)) {
      if (ids_to_preserve_.find(id) != ids_to_preserve_.end()) {
        bound_ = std::max(bound_, id + 1);
        return id;
      }
    }
  }

  const auto it = named_ids_.find(textValue);
  if (it == named_ids_.end()) {
    uint32_t id = next_id_++;
    if (!ids_to_preserve_.empty()) {
      while (ids_to_preserve_.find(id) != ids_to_preserve_.end()) {
        id = next_id_++;
      }
    }

    named_ids_.emplace(textValue, id);
    bound_ = std::max(bound_, id + 1);
    return id;
  }

  return it->second;
}